

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveInclude(Parser *parser,int flags)

{
  bool bVar1;
  Encoding EVar2;
  int iVar3;
  Token *token;
  CAssemblerCommand *this;
  undefined4 in_register_00000034;
  TextFile *file;
  StringLiteral fileNameParameter;
  vector<Expression,_std::allocator<Expression>_> parameters;
  path fileName;
  TextFile f;
  StringLiteral local_378;
  vector<Expression,_std::allocator<Expression>_> local_358;
  path local_338;
  string local_318;
  undefined1 local_2f8 [712];
  
  file = (TextFile *)CONCAT44(in_register_00000034,flags);
  token = Tokenizer::peekToken
                    (*(Tokenizer **)
                      (*(long *)&(file->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                                 field_0x8 + -0x18),0);
  local_358.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_358.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList((Parser *)file,&local_358,1,2);
  if (!bVar1) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0017f887;
  }
  local_378._value._M_dataplus._M_p = (pointer)&local_378._value.field_2;
  local_378._value._M_string_length = 0;
  local_378._value.field_2._M_local_buf[0] = '\0';
  bVar1 = Expression::evaluateString
                    (local_358.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_378,true);
  if (bVar1) {
    StringLiteral::path((path *)local_2f8,&local_378);
    getFullPathName(&local_338,(path *)local_2f8);
    ghc::filesystem::path::~path((path *)local_2f8);
    EVar2 = GUESS;
    if ((long)local_358.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_358.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x30) {
      local_2f8._8_8_ = 0;
      local_2f8[0x10] = '\0';
      local_2f8._0_8_ = local_2f8 + 0x10;
      bVar1 = Expression::evaluateString
                        (local_358.super__Vector_base<Expression,_std::allocator<Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1,(StringLiteral *)local_2f8,
                         true);
      if (bVar1) {
        EVar2 = getEncodingFromString((string *)local_2f8);
      }
      else {
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        EVar2 = GUESS;
      }
      if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
        operator_delete((void *)local_2f8._0_8_,CONCAT71(local_2f8._17_7_,local_2f8[0x10]) + 1);
      }
      if (bVar1) goto LAB_0017f727;
    }
    else {
LAB_0017f727:
      if (*(char *)(*(long *)&(file->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                              field_0xa0 + -2) == '\0') {
        this = (CAssemblerCommand *)operator_new(0x18);
        this->_vptr_CAssemblerCommand = (_func_int **)0x0;
        this->FileNum = 0;
        this->FileLine = 0;
        *(undefined8 *)&this->section = 0;
        CAssemblerCommand::CAssemblerCommand(this);
        this->_vptr_CAssemblerCommand = (_func_int **)&PTR__CAssemblerCommand_001be968;
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)this;
      }
      else {
        bVar1 = ghc::filesystem::exists(&local_338);
        if (bVar1) {
          TextFile::TextFile((TextFile *)local_2f8);
          iVar3 = TextFile::open((TextFile *)local_2f8,(char *)&local_338,0,(ulong)EVar2);
          if ((char)iVar3 == '\0') {
            ghc::filesystem::path::u8string_abi_cxx11_(&local_318,&local_338);
            Parser::printError<std::__cxx11::string>
                      ((Parser *)file,token,"Could not open included file \"%s\"",&local_318);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
            (parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
          }
          else {
            Parser::parseFile(parser,file,SUB81(local_2f8,0));
          }
          TextFile::~TextFile((TextFile *)local_2f8);
        }
        else {
          ghc::filesystem::path::u8string_abi_cxx11_((string *)local_2f8,&local_338);
          Parser::printError<std::__cxx11::string>
                    ((Parser *)file,token,"Included file \"%s\" does not exist",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8)
          ;
          if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
            operator_delete((void *)local_2f8._0_8_,CONCAT71(local_2f8._17_7_,local_2f8[0x10]) + 1);
          }
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
      }
    }
    ghc::filesystem::path::~path(&local_338);
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._value._M_dataplus._M_p != &local_378._value.field_2) {
    operator_delete(local_378._value._M_dataplus._M_p,
                    CONCAT71(local_378._value.field_2._M_allocated_capacity._1_7_,
                             local_378._value.field_2._M_local_buf[0]) + 1);
  }
LAB_0017f887:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_358);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveInclude(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> parameters;
	if (!parser.parseExpressionList(parameters,1,2))
		return nullptr;

	StringLiteral fileNameParameter;
	if (!parameters[0].evaluateString(fileNameParameter,true))
		return nullptr;

	auto fileName = getFullPathName(fileNameParameter.path());

	TextFile::Encoding encoding = TextFile::GUESS;
	if (parameters.size() == 2)
	{
		StringLiteral encodingName;
		if (!parameters[1].evaluateString(encodingName,true))
			return nullptr;
		
		encoding = getEncodingFromString(encodingName.string());
	}

	// don't include the file if it's inside a false block
	if (!parser.isInsideTrueBlock())
		return std::make_unique<DummyCommand>();

	if (!fs::exists(fileName))
	{
		parser.printError(start, "Included file \"%s\" does not exist",fileName.u8string());
		return nullptr;
	}

	TextFile f;
	if (!f.open(fileName,TextFile::Read,encoding))
	{
		parser.printError(start, "Could not open included file \"%s\"",fileName.u8string());
		return nullptr;
	}

	return parser.parseFile(f);
}